

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::EnableLanguage
          (cmGlobalGhsMultiGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *l,cmMakefile *mf,bool optional)

{
  cmMakefile *this_00;
  string_view local_a8;
  allocator<char> local_91;
  string local_90;
  string_view local_70 [2];
  allocator<char> local_49;
  string local_48;
  byte local_21;
  cmMakefile *pcStack_20;
  bool optional_local;
  cmMakefile *mf_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *l_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  local_21 = optional;
  pcStack_20 = mf;
  mf_local = (cmMakefile *)l;
  l_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_SYSTEM_NAME",&local_49);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_70,"GHS-MULTI");
  cmMakefile::AddDefinition(mf,&local_48,local_70[0]);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this_00 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"GHSMULTI",&local_91);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"1");
  cmMakefile::AddDefinition(this_00,&local_90,local_a8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  cmGlobalGenerator::EnableLanguage
            (&this->super_cmGlobalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)mf_local,pcStack_20,(bool)(local_21 & 1));
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::EnableLanguage(
  std::vector<std::string> const& l, cmMakefile* mf, bool optional)
{
  mf->AddDefinition("CMAKE_SYSTEM_NAME", "GHS-MULTI");

  mf->AddDefinition("GHSMULTI", "1"); // identifier for user CMake files

  this->cmGlobalGenerator::EnableLanguage(l, mf, optional);
}